

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataFlowAnalysis.cpp
# Opt level: O1

DataFlowState * __thiscall
slang::analysis::DataFlowAnalysis::topState
          (DataFlowState *__return_storage_ptr__,DataFlowAnalysis *this)

{
  memset(__return_storage_ptr__,0,0xa0);
  (__return_storage_ptr__->assigned).
  super_SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>.data_ =
       (pointer)(__return_storage_ptr__->assigned).
                super_SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>.
                firstElement;
  (__return_storage_ptr__->assigned).
  super_SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>.len = 0;
  (__return_storage_ptr__->assigned).
  super_SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>.cap = 2;
  __return_storage_ptr__->reachable = true;
  return __return_storage_ptr__;
}

Assistant:

DataFlowState DataFlowAnalysis::topState() const {
    return {};
}